

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZconsVisitor.cpp
# Opt level: O1

void __thiscall OpenMD::ZConsVisitor::update(ZConsVisitor *this)

{
  _Rb_tree_header *p_Var1;
  pointer pZVar2;
  _Base_ptr p_Var3;
  _Rb_tree_node_base *p_Var4;
  pointer pZVar5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  RealType time;
  
  p_Var1 = &(this->zmolStates_)._M_t._M_impl.super__Rb_tree_header;
  for (p_Var4 = (this->zmolStates_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != p_Var1;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    *(undefined4 *)&p_Var4[1].field_0x4 = 1;
  }
  time = Snapshot::getTime(this->currSnapshot_);
  readZconsFile(this,time);
  pZVar5 = (this->zconsReader_->fixedZmolData_).
           super__Vector_base<OpenMD::ZconsData,_std::allocator<OpenMD::ZconsData>_>._M_impl.
           super__Vector_impl_data._M_start;
  pZVar2 = (this->zconsReader_->fixedZmolData_).
           super__Vector_base<OpenMD::ZconsData,_std::allocator<OpenMD::ZconsData>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pZVar5 != pZVar2) {
    p_Var3 = (this->zmolStates_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      p_Var6 = &p_Var1->_M_header;
      if (p_Var3 != (_Base_ptr)0x0) {
        p_Var7 = p_Var3;
        do {
          if (pZVar5->zmolIndex <= (int)p_Var7[1]._M_color) {
            p_Var6 = p_Var7;
          }
          p_Var7 = (&p_Var7->_M_left)[(int)p_Var7[1]._M_color < pZVar5->zmolIndex];
        } while (p_Var7 != (_Base_ptr)0x0);
      }
      p_Var7 = &p_Var1->_M_header;
      if (((_Rb_tree_header *)p_Var6 != p_Var1) &&
         (p_Var7 = p_Var6, pZVar5->zmolIndex < (int)p_Var6[1]._M_color)) {
        p_Var7 = &p_Var1->_M_header;
      }
      *(undefined4 *)&p_Var7[1].field_0x4 = 0;
      pZVar5 = pZVar5 + 1;
    } while (pZVar5 != pZVar2);
  }
  return;
}

Assistant:

void ZConsVisitor::update() {
    Vector3d com;
    std::map<int, ZConsState>::iterator i;
    for (i = zmolStates_.begin(); i != zmolStates_.end(); ++i) {
      i->second = zsMoving;
    }

    readZconsFile(currSnapshot_->getTime());

    const std::vector<ZconsData>& fixedZmolData =
        zconsReader_->getFixedZMolData();
    std::vector<ZconsData>::const_iterator j;
    for (j = fixedZmolData.begin(); j != fixedZmolData.end(); ++j) {
      std::map<int, ZConsState>::iterator k = zmolStates_.find(j->zmolIndex);
      assert(k != zmolStates_.end());
      k->second = zsFixed;
    }
  }